

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_union.cc
# Opt level: O0

bool __thiscall S2CellUnion::Decode(S2CellUnion *this,Decoder *decoder)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  pointer __n;
  reference this_00;
  int local_60;
  int i;
  allocator<S2CellId> local_49;
  undefined1 local_48 [8];
  vector<S2CellId,_std::allocator<S2CellId>_> temp_cell_ids;
  uint64 num_cells;
  uchar version;
  Decoder *decoder_local;
  S2CellUnion *this_local;
  
  sVar3 = Decoder::avail(decoder);
  if (sVar3 < 9) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = Decoder::get8(decoder);
    if (bVar1 < 2) {
      __n = (pointer)Decoder::get64(decoder);
      if ((pointer)(long)FLAGS_s2cell_union_decode_max_num_cells < __n) {
        this_local._7_1_ = false;
      }
      else {
        temp_cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = __n;
        std::allocator<S2CellId>::allocator(&local_49);
        std::vector<S2CellId,_std::allocator<S2CellId>_>::vector
                  ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_48,(size_type)__n,&local_49)
        ;
        std::allocator<S2CellId>::~allocator(&local_49);
        for (local_60 = 0;
            (pointer)(long)local_60 <
            temp_cell_ids.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage; local_60 = local_60 + 1) {
          this_00 = std::vector<S2CellId,_std::allocator<S2CellId>_>::operator[]
                              ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_48,
                               (long)local_60);
          bVar2 = S2CellId::Decode(this_00,decoder);
          if (!bVar2) {
            this_local._7_1_ = false;
            goto LAB_00457b57;
          }
        }
        std::vector<S2CellId,_std::allocator<S2CellId>_>::swap
                  (&this->cell_ids_,(vector<S2CellId,_std::allocator<S2CellId>_> *)local_48);
        this_local._7_1_ = true;
LAB_00457b57:
        std::vector<S2CellId,_std::allocator<S2CellId>_>::~vector
                  ((vector<S2CellId,_std::allocator<S2CellId>_> *)local_48);
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool S2CellUnion::Decode(Decoder* const decoder) {
  // Should contain at least version and vector length.
  if (decoder->avail() < sizeof(unsigned char) + sizeof(uint64)) return false;
  unsigned char version = decoder->get8();
  if (version > kCurrentLosslessEncodingVersionNumber) return false;

  uint64 num_cells = decoder->get64();
  if (num_cells > FLAGS_s2cell_union_decode_max_num_cells) {
    return false;
  }

  vector<S2CellId> temp_cell_ids(num_cells);
  for (int i = 0; i < num_cells; ++i) {
    if (!temp_cell_ids[i].Decode(decoder)) return false;
  }
  cell_ids_.swap(temp_cell_ids);
  return true;
}